

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void blendps_(PDISASM pMyDisasm)

{
  bool bVar1;
  
  if (((pMyDisasm->Reserved_).EVEX.state != '\x01') && ((pMyDisasm->Prefix).OperandSize == '\x01'))
  {
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      (pMyDisasm->Prefix).OperandSize = '\b';
      (pMyDisasm->Instruction).Category = 0x110021;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vblendps",9);
      bVar1 = (pMyDisasm->Reserved_).VEX.L != '\0';
      (pMyDisasm->Reserved_).Register_ = (uint)bVar1 * 4 + 4;
      GxEx(pMyDisasm);
      (pMyDisasm->Reserved_).MemDecoration = bVar1 + 0x6d;
    }
    else {
      (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
      (pMyDisasm->Prefix).OperandSize = '\b';
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      (pMyDisasm->Instruction).Category = 0x80021;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"blendps",8);
      (pMyDisasm->Reserved_).Register_ = 4;
      GxEx(pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 3;
    }
    getImmediat8(&pMyDisasm->Operand3,pMyDisasm);
    return;
  }
  failDecode(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ blendps_(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
  }
  /* ========== 0x66 */
  else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
    if (GV.VEX.state == InUsePrefix) {
      pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
      pMyDisasm->Instruction.Category = AVX_INSTRUCTION + PACKED_BLENDING_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vblendps");
      #endif
      if (GV.VEX.L == 0) {
        GV.Register_ = SSE_REG;
        GxEx(pMyDisasm);
        GV.MemDecoration = Arg2_m128_xmm;
      }
      else {
        GV.Register_ = AVX_REG;
        GxEx(pMyDisasm);
        GV.MemDecoration = Arg2_m256_ymm;
      }
      getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
    }
    else {
      GV.OperandSize = GV.OriginalOperandSize;
      pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
      GV.MemDecoration = Arg2_m128_xmm;
      pMyDisasm->Instruction.Category = SSE41_INSTRUCTION+PACKED_BLENDING_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "blendps");
      #endif
      GV.Register_ = SSE_REG;
      GxEx(pMyDisasm);
      pMyDisasm->Operand1.AccessMode = READ + WRITE;
      getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
    }
  }
  else {
     failDecode(pMyDisasm);
  }
}